

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

int RWops20to12_close(SDL12_RWops *rwops12)

{
  int iVar1;
  
  iVar1 = 0;
  if ((rwops12 != (SDL12_RWops *)0x0) &&
     (iVar1 = (*rwops12->rwops20->close)(rwops12->rwops20), iVar1 == 0)) {
    (*SDL20_free)(rwops12);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int SDLCALL
RWops20to12_close(struct SDL12_RWops *rwops12)
{
    int rc = 0;
    if (rwops12) {
        rc = rwops12->rwops20->close(rwops12->rwops20);
        if (rc == 0) {
            SDL_FreeRW(rwops12);
        }
    }
    return rc;
}